

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void lowbd_fwd_txfm2d_8x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  code *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  int8_t *piVar15;
  ulong uVar16;
  uint uVar17;
  undefined7 in_register_00000009;
  undefined8 *puVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  __m128i buf0 [16];
  __m256i buf2 [8];
  __m128i buf1 [16];
  code *apcStack_370 [2];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  
  piVar15 = av1_fwd_txfm_shift_ls[7];
  uVar16 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    lVar21 = 0x100;
    do {
      uVar14 = *(undefined8 *)(input + 4);
      *(undefined8 *)((long)apcStack_370 + lVar21) = *(undefined8 *)input;
      *(undefined8 *)(local_360 + lVar21 + -8) = uVar14;
      input = input + stride;
      lVar21 = lVar21 + -0x10;
    } while (lVar21 != 0);
  }
  else {
    lVar21 = 0;
    do {
      uVar14 = *(undefined8 *)(input + 4);
      *(undefined8 *)(local_360 + lVar21) = *(undefined8 *)input;
      *(undefined8 *)(local_360 + lVar21 + 8) = uVar14;
      lVar21 = lVar21 + 0x10;
      input = input + stride;
    } while (lVar21 != 0x100);
  }
  pcVar2 = *(code **)((long)col_txfm8x16_arr + uVar16);
  bVar1 = *av1_fwd_txfm_shift_ls[7];
  uVar17 = (uint)(char)bVar1;
  if ((int)uVar17 < 0) {
    auVar22._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar22._2_2_ = auVar22._0_2_;
    auVar22._4_2_ = auVar22._0_2_;
    auVar22._6_2_ = auVar22._0_2_;
    auVar22._8_2_ = auVar22._0_2_;
    auVar22._10_2_ = auVar22._0_2_;
    auVar22._12_2_ = auVar22._0_2_;
    auVar22._14_2_ = auVar22._0_2_;
    lVar21 = 0;
    do {
      auVar23 = vpaddsw_avx(auVar22,*(undefined1 (*) [16])(local_360 + lVar21));
      auVar23 = vpsraw_avx(auVar23,ZEXT416(-uVar17));
      *(undefined1 (*) [16])(local_360 + lVar21) = auVar23;
      lVar21 = lVar21 + 0x10;
    } while (lVar21 != 0x100);
  }
  else if (bVar1 != 0) {
    lVar21 = 0;
    do {
      auVar22 = vpsllw_avx(*(undefined1 (*) [16])(local_360 + lVar21),ZEXT416(uVar17));
      *(undefined1 (*) [16])(local_360 + lVar21) = auVar22;
      lVar21 = lVar21 + 0x10;
    } while (lVar21 != 0x100);
  }
  apcStack_370[1] = *(code **)((long)row_txfm8x16_arr + uVar16);
  (*pcVar2)(local_360,local_360,0xd);
  bVar1 = piVar15[1];
  if ((char)bVar1 < '\0') {
    auVar23._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar23._2_2_ = auVar23._0_2_;
    auVar23._4_2_ = auVar23._0_2_;
    auVar23._6_2_ = auVar23._0_2_;
    auVar23._8_2_ = auVar23._0_2_;
    auVar23._10_2_ = auVar23._0_2_;
    auVar23._12_2_ = auVar23._0_2_;
    auVar23._14_2_ = auVar23._0_2_;
    lVar21 = 0;
    do {
      auVar22 = vpaddsw_avx(auVar23,*(undefined1 (*) [16])(local_360 + lVar21));
      auVar22 = vpsraw_avx(auVar22,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [16])(local_360 + lVar21) = auVar22;
      lVar21 = lVar21 + 0x10;
    } while (lVar21 != 0x100);
  }
  else if (bVar1 != 0) {
    lVar21 = 0;
    do {
      auVar22 = vpsllw_avx(*(undefined1 (*) [16])(local_360 + lVar21),
                           ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [16])(local_360 + lVar21) = auVar22;
      lVar21 = lVar21 + 0x10;
    } while (lVar21 != 0x100);
  }
  auVar5 = vpunpcklwd_avx(local_360,local_350);
  auVar6 = vpunpcklwd_avx(local_340,local_330);
  auVar7 = vpunpcklwd_avx(local_320,local_310);
  auVar8 = vpunpcklwd_avx(local_300,local_2f0);
  auVar22 = vpunpckhwd_avx(local_360,local_350);
  auVar23 = vpunpckhwd_avx(local_340,local_330);
  auVar3 = vpunpckhwd_avx(local_320,local_310);
  auVar4 = vpunpckhwd_avx(local_300,local_2f0);
  auVar9 = vpunpckldq_avx(auVar5,auVar6);
  auVar10 = vpunpckldq_avx(auVar7,auVar8);
  auVar11 = vpunpckldq_avx(auVar22,auVar23);
  auVar12 = vpunpckldq_avx(auVar3,auVar4);
  auVar5 = vpunpckhdq_avx(auVar5,auVar6);
  auVar6 = vpunpckhdq_avx(auVar7,auVar8);
  auVar22 = vpunpckhdq_avx(auVar22,auVar23);
  auVar23 = vpunpckhdq_avx(auVar3,auVar4);
  local_160 = vpunpcklqdq_avx(auVar9,auVar10);
  puVar20 = (undefined8 *)local_160;
  local_150 = vpunpckhqdq_avx(auVar9,auVar10);
  local_140 = vpunpcklqdq_avx(auVar5,auVar6);
  local_130 = vpunpckhqdq_avx(auVar5,auVar6);
  local_120 = vpunpcklqdq_avx(auVar11,auVar12);
  local_110 = vpunpckhqdq_avx(auVar11,auVar12);
  local_100 = vpunpcklqdq_avx(auVar22,auVar23);
  local_f0 = vpunpckhqdq_avx(auVar22,auVar23);
  lVar21 = 0x80;
  puVar18 = (undefined8 *)local_e0;
  auVar5 = vpunpcklwd_avx(local_2e0,local_2d0);
  auVar6 = vpunpcklwd_avx(local_2c0,local_2b0);
  auVar7 = vpunpcklwd_avx(local_2a0,local_290);
  auVar8 = vpunpcklwd_avx(local_280,local_270);
  auVar22 = vpunpckhwd_avx(local_2e0,local_2d0);
  auVar23 = vpunpckhwd_avx(local_2c0,local_2b0);
  auVar3 = vpunpckhwd_avx(local_2a0,local_290);
  auVar4 = vpunpckhwd_avx(local_280,local_270);
  auVar9 = vpunpckldq_avx(auVar5,auVar6);
  auVar10 = vpunpckldq_avx(auVar7,auVar8);
  auVar11 = vpunpckldq_avx(auVar22,auVar23);
  auVar12 = vpunpckldq_avx(auVar3,auVar4);
  auVar5 = vpunpckhdq_avx(auVar5,auVar6);
  auVar6 = vpunpckhdq_avx(auVar7,auVar8);
  auVar22 = vpunpckhdq_avx(auVar22,auVar23);
  auVar23 = vpunpckhdq_avx(auVar3,auVar4);
  local_e0 = vpunpcklqdq_avx(auVar9,auVar10);
  local_d0 = vpunpckhqdq_avx(auVar9,auVar10);
  local_c0 = vpunpcklqdq_avx(auVar5,auVar6);
  local_b0 = vpunpckhqdq_avx(auVar5,auVar6);
  local_a0 = vpunpcklqdq_avx(auVar11,auVar12);
  local_90 = vpunpckhqdq_avx(auVar11,auVar12);
  local_80 = vpunpcklqdq_avx(auVar22,auVar23);
  local_70 = vpunpckhqdq_avx(auVar22,auVar23);
  puVar19 = puVar18;
  if (tx_type < 0x10 && (0x7f1fU >> (tx_type & 0x1f) & 1) == 0) {
    puVar20 = (undefined8 *)local_160;
    do {
      uVar14 = puVar20[1];
      *(undefined8 *)((long)apcStack_370 + lVar21) = *puVar20;
      *(undefined8 *)(local_360 + lVar21 + -8) = uVar14;
      puVar20 = puVar20 + 2;
      lVar21 = lVar21 + -0x10;
    } while (lVar21 != 0);
    lVar21 = 0x80;
    do {
      uVar14 = puVar18[1];
      *(undefined8 *)(local_2f0 + lVar21) = *puVar18;
      *(undefined8 *)(local_2f0 + lVar21 + 8) = uVar14;
      puVar18 = puVar18 + 2;
      lVar21 = lVar21 + -0x10;
      puVar19 = (undefined8 *)local_2e0;
      puVar20 = (undefined8 *)local_360;
    } while (lVar21 != 0);
  }
  local_250 = *puVar19;
  uStack_248 = puVar19[1];
  local_260 = *puVar20;
  uStack_258 = puVar20[1];
  local_230 = puVar19[2];
  uStack_228 = puVar19[3];
  local_240 = puVar20[2];
  uStack_238 = puVar20[3];
  local_210 = puVar19[4];
  uStack_208 = puVar19[5];
  local_220 = puVar20[4];
  uStack_218 = puVar20[5];
  local_1f0 = puVar19[6];
  uStack_1e8 = puVar19[7];
  local_200 = puVar20[6];
  uStack_1f8 = puVar20[7];
  local_1d0 = puVar19[8];
  uStack_1c8 = puVar19[9];
  local_1e0 = puVar20[8];
  uStack_1d8 = puVar20[9];
  local_1b0 = puVar19[10];
  uStack_1a8 = puVar19[0xb];
  local_1c0 = puVar20[10];
  uStack_1b8 = puVar20[0xb];
  local_190 = puVar19[0xc];
  uStack_188 = puVar19[0xd];
  local_1a0 = puVar20[0xc];
  uStack_198 = puVar20[0xd];
  local_180 = puVar20[0xe];
  uStack_178 = puVar20[0xf];
  local_170 = puVar19[0xe];
  uStack_168 = puVar19[0xf];
  (*apcStack_370[1])(&local_260,&local_260,0xd);
  bVar1 = piVar15[2];
  if ((char)bVar1 < '\0') {
    auVar26._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar26._2_2_ = auVar26._0_2_;
    auVar26._4_2_ = auVar26._0_2_;
    auVar26._6_2_ = auVar26._0_2_;
    auVar26._8_2_ = auVar26._0_2_;
    auVar26._10_2_ = auVar26._0_2_;
    auVar26._12_2_ = auVar26._0_2_;
    auVar26._14_2_ = auVar26._0_2_;
    auVar26._16_2_ = auVar26._0_2_;
    auVar26._18_2_ = auVar26._0_2_;
    auVar26._20_2_ = auVar26._0_2_;
    auVar26._22_2_ = auVar26._0_2_;
    auVar26._24_2_ = auVar26._0_2_;
    auVar26._26_2_ = auVar26._0_2_;
    auVar26._28_2_ = auVar26._0_2_;
    auVar26._30_2_ = auVar26._0_2_;
    lVar21 = 0;
    do {
      auVar24 = vpaddsw_avx2(auVar26,*(undefined1 (*) [32])((long)&local_260 + lVar21));
      auVar24 = vpsraw_avx2(auVar24,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)&local_260 + lVar21) = auVar24;
      lVar21 = lVar21 + 0x20;
    } while (lVar21 != 0x100);
  }
  else if (bVar1 != 0) {
    lVar21 = 0;
    do {
      auVar26 = vpsllw_avx2(*(undefined1 (*) [32])((long)&local_260 + lVar21),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)&local_260 + lVar21) = auVar26;
      lVar21 = lVar21 + 0x20;
    } while (lVar21 != 0x100);
  }
  lVar21 = 0;
  auVar24._8_2_ = 1;
  auVar24._0_8_ = 0x1000100010001;
  auVar24._10_2_ = 1;
  auVar24._12_2_ = 1;
  auVar24._14_2_ = 1;
  auVar24._16_2_ = 1;
  auVar24._18_2_ = 1;
  auVar24._20_2_ = 1;
  auVar24._22_2_ = 1;
  auVar24._24_2_ = 1;
  auVar24._26_2_ = 1;
  auVar24._28_2_ = 1;
  auVar24._30_2_ = 1;
  auVar25._8_4_ = 0x80016a1;
  auVar25._0_8_ = 0x80016a1080016a1;
  auVar25._12_4_ = 0x80016a1;
  auVar25._16_4_ = 0x80016a1;
  auVar25._20_4_ = 0x80016a1;
  auVar25._24_4_ = 0x80016a1;
  auVar25._28_4_ = 0x80016a1;
  do {
    auVar13 = vpermq_avx2(*(undefined1 (*) [32])((long)&local_260 + lVar21),0xd8);
    auVar26 = vpunpcklwd_avx2(auVar13,auVar24);
    auVar13 = vpunpckhwd_avx2(auVar13,auVar24);
    auVar26 = vpmaddwd_avx2(auVar26,auVar25);
    auVar27 = vpsrad_avx2(auVar26,0xc);
    auVar26 = vpmaddwd_avx2(auVar13,auVar25);
    auVar26 = vpsrad_avx2(auVar26,0xc);
    *(undefined1 (*) [32])((long)output + lVar21 * 2) = auVar27;
    *(undefined1 (*) [32])((long)output + lVar21 * 2 + 0x20) = auVar26;
    lVar21 = lVar21 + 0x20;
  } while (lVar21 != 0x100);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_8x16_avx2(const int16_t *input, int32_t *output,
                                       int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  __m256i buf2[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm8x16_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);
  transpose_16bit_8x8(buf0 + 8, buf1 + 8);

  __m128i *bufl, *bufu;
  if (lr_flip) {
    bufl = buf0;
    bufu = buf0 + 8;
    flip_buf_sse2(buf1 + width * 0, bufl, width);
    flip_buf_sse2(buf1 + width * 1, bufu, width);
  } else {
    bufl = buf1 + width * 0;
    bufu = buf1 + width * 1;
  }
  pack_reg(bufl, bufu, buf2);
  row_txfm(buf2, buf2, cos_bit_row);
  round_shift_16bit_w16_avx2(buf2, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2(buf2, output, height, width);
}